

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::minorUpdateRows()::__0&>
               (HighsInt start,HighsInt end,anon_class_32_4_068a6c9c *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  HEkkDual *pHVar3;
  HVectorBase<double> *pHVar4;
  HighsSplitDeque *pHVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint32_t uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  TaskGroup tg;
  TaskGroup local_40;
  
  iVar11 = end - start;
  if (grainSize < iVar11) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar7 = (long *)__tls_get_addr(&PTR_00441ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar7;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar5 = local_40.workerDeque;
      iVar11 = start + end >> 1;
      uVar6 = ((local_40.workerDeque)->ownerData).head;
      uVar8 = (ulong)uVar6;
      if (uVar8 < 0x2000) {
        uVar9 = (uint32_t)(uVar8 + 1);
        ((local_40.workerDeque)->ownerData).head = uVar9;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar8].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData =
             &PTR_operator___004414a8;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 8) = iVar11;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x10) =
             grainSize;
        *(anon_class_32_4_068a6c9c **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar8 << 0x20 | uVar8 + 1;
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = uVar9;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
          uVar6 = (pHVar5->ownerData).head;
        }
        (pHVar5->ownerData).head = uVar6 + 1;
        for_each<HEkkDual::minorUpdateRows()::__0&>(iVar11,end,f,grainSize);
      }
      end = iVar11;
    } while (grainSize < iVar11 - start);
    iVar10 = iVar11 - start;
    if (iVar10 != 0 && start <= iVar11) {
      pHVar3 = f->this;
      lVar12 = (long)start;
      do {
        pHVar4 = (*f->multi_vector)[lVar12];
        HVectorBase<double>::saxpy<double,double>(pHVar4,(*f->multi_xpivot)[lVar12],*f->Row);
        HVectorBase<double>::tight(pHVar4);
        if (pHVar3->edge_weight_mode == kSteepestEdge) {
          dVar13 = HVectorBase<double>::norm2(pHVar4);
          (*f->multi_xpivot)[lVar12] = dVar13;
        }
        lVar12 = lVar12 + 1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pHVar3 = f->this;
    lVar12 = (long)start;
    do {
      pHVar4 = (*f->multi_vector)[lVar12];
      HVectorBase<double>::saxpy<double,double>(pHVar4,(*f->multi_xpivot)[lVar12],*f->Row);
      HVectorBase<double>::tight(pHVar4);
      if (pHVar3->edge_weight_mode == kSteepestEdge) {
        dVar13 = HVectorBase<double>::norm2(pHVar4);
        (*f->multi_xpivot)[lVar12] = dVar13;
      }
      lVar12 = lVar12 + 1;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}